

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressBegin_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_parameters params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  ZSTD_CCtx_params ZStack_d8;
  
  memset(&ZStack_d8,0,0xb0);
  ZStack_d8.cParams._0_8_ = params.cParams._0_8_;
  ZStack_d8.cParams.hashLog = params.cParams.hashLog;
  ZStack_d8.cParams._20_8_ = params.cParams._20_8_;
  ZStack_d8.cParams.searchLog = params.cParams.searchLog;
  ZStack_d8.cParams.minMatch = params.cParams.minMatch;
  ZStack_d8.fParams.contentSizeFlag = params.fParams.contentSizeFlag;
  ZStack_d8.fParams.checksumFlag = params.fParams.checksumFlag;
  ZStack_d8.fParams.noDictIDFlag = params.fParams.noDictIDFlag;
  ZStack_d8.useRowMatchFinder = ZSTD_urm_enableRowMatchFinder - (params.cParams.windowLog < 0xf);
  if (params.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
    ZStack_d8.useRowMatchFinder = ZSTD_urm_disableRowMatchFinder;
  }
  sVar1 = ZSTD_compressBegin_advanced_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,&ZStack_d8,
                     pledgedSrcSize);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_advanced(ZSTD_CCtx* cctx,
                             const void* dict, size_t dictSize,
                                   ZSTD_parameters params, unsigned long long pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_CCtxParams_init_internal(&cctxParams, &params, ZSTD_NO_CLEVEL);
    return ZSTD_compressBegin_advanced_internal(cctx,
                                            dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                            NULL /*cdict*/,
                                            &cctxParams, pledgedSrcSize);
}